

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

transformation_t *
opengv::absolute_pose::gpnp
          (transformation_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,Indices *indices)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  transformation_t *ptVar4;
  int iVar5;
  long lVar6;
  long *plVar7;
  int iVar8;
  size_t i_1;
  long lVar9;
  double dVar10;
  size_t i;
  ulong uVar11;
  size_t i_2;
  double *pdVar12;
  ResScalar RVar13;
  ResScalar RVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  MatrixXd weights;
  points_t c;
  MatrixXd p;
  MatrixXd D;
  MatrixXd invD;
  MatrixXd A;
  Matrix<double,_12,_1,_0,_12,_1> a;
  MatrixXd b;
  point_t c0;
  MatrixXd V;
  MatrixXd pinvA;
  Vector3d e3;
  Vector3d e2;
  Vector3d e1;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD2;
  rotation_t camRotation;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  long local_b40;
  void *local_b38;
  long local_b30;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_b20;
  Matrix<double,__1,__1,_0,__1,__1> local_b08;
  Matrix<double,_12,_12,_0,_12,_12> *local_af0;
  long **local_ae8;
  long *local_ad8;
  long local_ad0;
  undefined1 local_ac0 [16];
  transformation_t *local_aa8;
  ResScalar local_aa0;
  MatrixType local_a98;
  Matrix<double,_12,_1,_0,_12,_1> local_a80;
  Matrix<double,_3,_1,_0,_3,_1> local_a08;
  undefined1 local_9f0 [24];
  DenseStorage<double,__1,__1,__1,_0> local_9d8;
  double *local_9c0 [3];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_9a8 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_990 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_978 [24];
  undefined1 local_960 [544];
  Matrix<double,_12,_12,_0,_12,_12> local_740;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_298;
  
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = 0.0;
  local_aa8 = __return_storage_ptr__;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_9f0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_740);
  lVar9 = 0;
  uVar11 = 0;
  while( true ) {
    if (indices->_numberCorrespondences <= uVar11) break;
    if (indices->_useIndices == false) {
      iVar8 = (int)uVar11;
    }
    else {
      iVar8 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar9 >> 0x1e));
    }
    (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_298,adapter,(long)iVar8);
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[0] = (double)local_9f0;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[1] = (double)&local_298;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
               m_data.array[0],
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)&local_740);
    uVar11 = uVar11 + 1;
    lVar9 = lVar9 + 0x100000000;
  }
  auVar3 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,indices->_numberCorrespondences);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_9f0;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = auVar3._0_8_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
             m_data.array[0],
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_740);
  local_298.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)
       CONCAT44(local_298.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data._4_4_,3);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)indices->_numberCorrespondences;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_b08,(int *)&local_298,
             (unsigned_long *)&local_740);
  lVar9 = 0;
  for (dVar10 = 0.0; (ulong)dVar10 < indices->_numberCorrespondences;
      dVar10 = (double)((long)dVar10 + 1)) {
    if (indices->_useIndices == false) {
      iVar8 = SUB84(dVar10,0);
    }
    else {
      iVar8 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar9 >> 0x1e));
    }
    (*adapter->_vptr_AbsoluteAdapterBase[6])(local_960,adapter,(long)iVar8);
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[3] = (double)&local_b08;
    local_298.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
    m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         (Index)local_9f0;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[0] = (double)(local_b08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data +
                       local_b08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows * (long)dVar10);
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[1] = (double)local_b08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[4] = 0.0;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[6] = (double)local_b08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[5] = dVar10;
    local_298.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
    m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)local_960;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_740,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)&local_298);
    lVar9 = lVar9 + 0x100000000;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_298,&local_b08,0x28);
  local_b20._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b20._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b20._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_b20,(value_type *)local_9f0);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = (double)local_298.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [4] = 15.0;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [5] = (double)local_298.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [6] = (double)local_298.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [9] = 0.0;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [10] = 0.0;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xb] = (double)local_298.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_9f0;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [8] = (double)&local_298;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_960,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
              *)&local_740);
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_b20,(Matrix<double,_3,_1,_0,_3,_1> *)local_960);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [5] = (double)(local_298.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data +
                local_298.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = (double)local_298.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [4] = 15.0;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [6] = (double)local_298.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [9] = 0.0;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [10] = 4.94065645841247e-324;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xb] = (double)local_298.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_9f0;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [8] = (double)&local_298;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_960,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
              *)&local_740);
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_b20,(Matrix<double,_3,_1,_0,_3,_1> *)local_960);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [5] = (double)(local_298.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data +
                local_298.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows * 2);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = (double)local_298.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [4] = 15.0;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [6] = (double)local_298.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_rows;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [9] = 0.0;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [10] = 9.88131291682493e-324;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xb] = (double)local_298.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_9f0;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [8] = (double)&local_298;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_960,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
              *)&local_740);
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_b20,(Matrix<double,_3,_1,_0,_3,_1> *)local_960);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)(local_b20._M_impl.super__Vector_impl_data._M_start + 1);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = (double)local_9f0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_978,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_740);
  RVar13 = Eigen::internal::
           dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
           ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_978,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_978);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)(local_b20._M_impl.super__Vector_impl_data._M_start + 2);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = (double)local_9f0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_990,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_740);
  local_ac0._0_8_ =
       Eigen::internal::
       dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
       ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_990,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_990);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)(local_b20._M_impl.super__Vector_impl_data._M_start + 3);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = (double)local_9f0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_9a8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_740);
  local_aa0 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_9a8,
                    (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_9a8);
  local_960._0_4_ = 4;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)indices->_numberCorrespondences;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_b38,(int *)local_960,(unsigned_long *)&local_740
            );
  for (pdVar12 = (double *)0x0; pdVar12 < (double *)indices->_numberCorrespondences;
      pdVar12 = (double *)((long)pdVar12 + 1)) {
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[3] = (double)&local_b08;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[0] = (double)(local_b08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data +
                       local_b08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows * (long)pdVar12);
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[1] = (double)local_b08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[4] = 0.0;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[6] = (double)local_b08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
    array[5] = (double)pdVar12;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_960,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               &local_740);
    RVar14 = Eigen::internal::
             dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
             ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_960,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_978);
    *(double *)((long)local_b38 + local_b30 * (long)pdVar12 * 8 + 8) = RVar14 / RVar13;
    RVar14 = Eigen::internal::
             dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
             ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_960,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_990);
    *(double *)((long)local_b38 + local_b30 * (long)pdVar12 * 8 + 0x10) =
         RVar14 / (double)local_ac0._0_8_;
    RVar14 = Eigen::internal::
             dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
             ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_960,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_9a8);
    lVar9 = local_b30 * (long)pdVar12;
    *(double *)((long)local_b38 + lVar9 * 8 + 0x18) = RVar14 / local_aa0;
    *(double *)((long)local_b38 + lVar9 * 8) =
         1.0 - (RVar14 / local_aa0 +
               *(double *)((long)local_b38 + lVar9 * 8 + 8) +
               *(double *)((long)local_b38 + lVar9 * 8 + 0x10));
  }
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)((long)indices->_numberCorrespondences * 2);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = 5.92878775009496e-323;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a98,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_740);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)(indices->_numberCorrespondences * 2);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = 4.94065645841247e-324;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a08,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_740);
  lVar9 = 8;
  local_ac0._8_8_ = 0x8000000000000000;
  local_ac0._0_8_ = 0x8000000000000000;
  uVar11 = 0;
  local_b40 = 0;
  while (uVar11 < indices->_numberCorrespondences) {
    iVar8 = (int)uVar11;
    lVar6 = local_b40 >> 0x1e;
    iVar5 = iVar8;
    if (indices->_useIndices != false) {
      iVar5 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar6);
    }
    (*adapter->_vptr_AbsoluteAdapterBase[4])(local_960,adapter,(long)iVar5);
    iVar5 = iVar8;
    if (indices->_useIndices != false) {
      iVar5 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar6);
    }
    (*adapter->_vptr_AbsoluteAdapterBase[5])(&local_740,adapter,(long)iVar5);
    if (indices->_useIndices != false) {
      iVar8 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar6);
    }
    (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_ad8,adapter,(long)iVar8);
    local_af0 = &local_740;
    local_ae8 = &local_ad8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_a80,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_af0);
    lVar6 = local_b30 * uVar11;
    uVar11 = uVar11 + 1;
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data + lVar9 + -8) =
         *(double *)((long)local_b38 + lVar6 * 8) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[2];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x10 + -8 + lVar9) =
         (double)(*(ulong *)((long)local_b38 + lVar6 * 8) ^ local_ac0._0_8_) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[0];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x18 + -8 + lVar9) =
         *(double *)((long)local_b38 + lVar6 * 8 + 8) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[2];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x28 + -8 + lVar9) =
         (double)(*(ulong *)((long)local_b38 + lVar6 * 8 + 8) ^ local_ac0._0_8_) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[0];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x30 + -8 + lVar9) =
         *(double *)((long)local_b38 + lVar6 * 8 + 0x10) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[2];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x40 + -8 + lVar9) =
         (double)(*(ulong *)((long)local_b38 + lVar6 * 8 + 0x10) ^ local_ac0._0_8_) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[0];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x48 + -8 + lVar9) =
         *(double *)((long)local_b38 + lVar6 * 8 + 0x18) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[2];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x58 + -8 + lVar9) =
         (double)(*(ulong *)((long)local_b38 + lVar6 * 8 + 0x18) ^ local_ac0._0_8_) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[0];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows * 8
     + lVar9) = *(double *)((long)local_b38 + lVar6 * 8) *
                local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                m_data.array[2];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x10 + lVar9) =
         (double)(*(ulong *)((long)local_b38 + lVar6 * 8) ^ local_ac0._0_8_) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[1];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x20 + lVar9) =
         *(double *)((long)local_b38 + lVar6 * 8 + 8) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[2];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x28 + lVar9) =
         (double)(*(ulong *)((long)local_b38 + lVar6 * 8 + 8) ^ local_ac0._0_8_) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[1];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x38 + lVar9) =
         *(double *)((long)local_b38 + lVar6 * 8 + 0x10) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[2];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x40 + lVar9) =
         (double)(*(ulong *)((long)local_b38 + lVar6 * 8 + 0x10) ^ local_ac0._0_8_) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[1];
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x50 + lVar9) =
         *(double *)((long)local_b38 + lVar6 * 8 + 0x18) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[2];
    local_b40 = local_b40 + 0x100000000;
    *(double *)
     ((long)local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data +
     local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
     0x58 + lVar9) =
         (double)(*(ulong *)((long)local_b38 + lVar6 * 8 + 0x18) ^ local_ac0._0_8_) *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[1];
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[2];
    auVar3._4_4_ = local_960._4_4_;
    auVar3._0_4_ = local_960._0_4_;
    auVar3._8_8_ = 0;
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (double)local_960._16_8_ *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[0];
    auVar3 = vfmsub231sd_fma(auVar17,auVar15,auVar3);
    *(long *)((long)local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array[0] + lVar9 + -8) = auVar3._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[2];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_960._8_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         (double)local_960._16_8_ *
         local_a80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
         array[1];
    auVar3 = vfmsub231sd_fma(auVar18,auVar16,auVar1);
    *(long *)((long)local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array[0] + lVar9) = auVar3._0_8_;
    lVar9 = lVar9 + 0x10;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_960,&local_a98,0x28);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = 5.92878775009496e-323;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = 5.92878775009496e-323;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_ad8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_740);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_af0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_960 + 0x30));
  lVar9 = 0;
  plVar7 = local_ad8;
  while (lVar9 != 0xc) {
    dVar10 = (local_af0->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>).m_storage
             .m_data.array[lVar9];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar10;
    lVar9 = lVar9 + 1;
    uVar2 = vcmpsd_avx512f(auVar19,ZEXT816(0x3eb0c6f7a0b5ed8d),0xe);
    *plVar7 = (ulong)((byte)uVar2 & 1) * (long)(1.0 / dVar10);
    plVar7 = plVar7 + local_ad0 + 1;
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)(local_9f0 + 0x18),
             (DenseStorage<double,__1,__1,__1,_0> *)(local_960 + 0x18));
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)(local_9f0 + 0x18);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = (double)&local_ad8;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = (double)local_960;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_9c0,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_740);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = (double)&local_a08;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_9c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_a80,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_740);
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,12,0,12,12>>::
  _set_noalias<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,12,12,0,12,12>> *)&local_740,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_9f0 + 0x18));
  ptVar4 = local_aa8;
  modules::gpnp_main(&local_a80,&local_740,(points_t *)&local_b20,local_aa8);
  Eigen::internal::handmade_aligned_free(local_9c0[0]);
  Eigen::internal::handmade_aligned_free(local_9d8.m_data);
  Eigen::internal::handmade_aligned_free(local_af0);
  Eigen::internal::handmade_aligned_free(local_ad8);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_960);
  Eigen::internal::handmade_aligned_free
            ((void *)local_a08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0]);
  Eigen::internal::handmade_aligned_free
            (local_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  Eigen::internal::handmade_aligned_free(local_b38);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_b20);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_298);
  Eigen::internal::handmade_aligned_free
            (local_b08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  return ptVar4;
}

Assistant:

transformation_t gpnp(
    const AbsoluteAdapterBase & adapter,
    const Indices & indices )
{
  assert( indices.size() > 5 );

  //compute the centroid
  point_t c0 = Eigen::Vector3d::Zero();
  for( size_t i = 0; i < indices.size(); i++ )
    c0 = c0 + adapter.getPoint(indices[i]);
  c0 = c0 / indices.size();

  //compute the point-cloud
  Eigen::MatrixXd p(3,indices.size());
  for( size_t i = 0; i < indices.size(); i++ )
    p.col(i) = adapter.getPoint(indices[i]) - c0;

  //compute the moment
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      p,
      Eigen::ComputeThinU | Eigen::ComputeThinV );

  //define the control points
  points_t c;
  c.push_back(c0);
  //c.push_back(c0 + SVD.singularValues()[0] * SVD.matrixU().col(0));
  //c.push_back(c0 + SVD.singularValues()[1] * SVD.matrixU().col(1));
  //c.push_back(c0 + SVD.singularValues()[2] * SVD.matrixU().col(2));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(0));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(1));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(2));

  //derive the barycentric frame
  Eigen::Vector3d e1 = c[1]-c0;
  double e1dote1 = e1.dot(e1);
  Eigen::Vector3d e2 = c[2]-c0;
  double e2dote2 = e2.dot(e2);
  Eigen::Vector3d e3 = c[3]-c0;
  double e3dote3 = e3.dot(e3);

  //derive the weighting factors
  Eigen::MatrixXd weights(4,indices.size());
  for( size_t i = 0; i < indices.size(); i++ )
  {
    Eigen::Vector3d temp = p.col(i);
    weights(1,i) = temp.dot(e1)/e1dote1;
    weights(2,i) = temp.dot(e2)/e2dote2;
    weights(3,i) = temp.dot(e3)/e3dote3;
    weights(0,i) = 1.0-(weights(1,i)+weights(2,i)+weights(3,i));
  }

  //setup matrix A and vector b
  Eigen::MatrixXd A = Eigen::MatrixXd::Zero(2*indices.size(),12);
  Eigen::MatrixXd b = Eigen::MatrixXd::Zero(2*indices.size(),1);
  for( size_t i = 0; i < indices.size(); i++ )
  {
    translation_t camOffset = adapter.getCamOffset(indices[i]);
    rotation_t camRotation = adapter.getCamRotation(indices[i]);
    //respect the rotation
    bearingVector_t f = camRotation * adapter.getBearingVector(indices[i]);

    A(2*i,0)  =  weights(0,i)*f[2];
    A(2*i,2)  = -weights(0,i)*f[0];
    A(2*i,3)  =  weights(1,i)*f[2];
    A(2*i,5)  = -weights(1,i)*f[0];
    A(2*i,6)  =  weights(2,i)*f[2];
    A(2*i,8)  = -weights(2,i)*f[0];
    A(2*i,9)  =  weights(3,i)*f[2];
    A(2*i,11) = -weights(3,i)*f[0];

    A(2*i+1,1)  =  weights(0,i)*f[2];
    A(2*i+1,2)  = -weights(0,i)*f[1];
    A(2*i+1,4)  =  weights(1,i)*f[2];
    A(2*i+1,5)  = -weights(1,i)*f[1];
    A(2*i+1,7)  =  weights(2,i)*f[2];
    A(2*i+1,8)  = -weights(2,i)*f[1];
    A(2*i+1,10) =  weights(3,i)*f[2];
    A(2*i+1,11) = -weights(3,i)*f[1];

    b(2*i,0)   = f[2]*camOffset[0]-f[0]*camOffset[2];
    b(2*i+1,0) = f[2]*camOffset[1]-f[1]*camOffset[2];
  }

  //computing the SVD
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD2(
      A,
      Eigen::ComputeThinV | Eigen::ComputeThinU );

  //computing the pseudoinverse
  Eigen::MatrixXd invD = Eigen::MatrixXd::Zero(12,12);
  Eigen::MatrixXd D = SVD2.singularValues();
  for( size_t i = 0; i < 12; i++ )
  {
    if( D(i,0) > 1.e-6 )
      invD(i,i) = 1.0/D(i,0);
    else
      invD(i,i) = 0.0;
  }

  //Extract the nullsapce vectors;
  Eigen::MatrixXd V = SVD2.matrixV();

  //computing the nullspace intercept
  Eigen::MatrixXd pinvA = V * invD * SVD2.matrixU().transpose();

  //compute the intercept
  Eigen::Matrix<double,12,1> a = pinvA * b;

  //compute the solution
  transformation_t transformation;
  modules::gpnp_main( a, V, c, transformation );
  return transformation;
}